

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O2

Tensor<2> *
Omega_h::average_metric_finish<2>
          (Tensor<2> *__return_storage_ptr__,Tensor<2> am,Int n,bool has_degen)

{
  Tensor<2> m;
  Int j;
  long lVar1;
  long lVar2;
  Vector<2> c_1;
  Matrix<2,_2> c;
  double local_68 [4];
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  double dStack_10;
  
  if (n == 0 && has_degen) {
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_
    [0] = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_
    [1] = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_
    [0] = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_
    [1] = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  }
  else {
    local_38 = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    dStack_30 = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    local_48 = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    dStack_40 = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      local_68[0] = local_68[lVar1 * 2 + 4];
      local_68[1] = local_68[lVar1 * 2 + 5];
      for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
        local_68[lVar2 + 2] = local_68[lVar2] / (double)n;
      }
      local_68[lVar1 * 2 + 8] = local_68[2];
      local_68[lVar1 * 2 + 9] = local_68[3];
    }
    m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] = (double)uStack_20;
    m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] = (double)local_28;
    m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] = (double)local_18;
    m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] = dStack_10;
    exp_spd_old<2>(m);
  }
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> average_metric_finish(
    Tensor<dim> am, Int const n, bool const has_degen) {
  if (has_degen && n == 0) return am;
  am /= n;
  return delinearize_metric(am);
}